

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O3

void __thiscall calculator::Token::Token(Token *this,char c)

{
  long *plVar1;
  long lVar2;
  undefined1 local_2cb;
  undefined1 local_2ca;
  undefined1 local_2c9;
  undefined4 local_2c8 [2];
  undefined1 *local_2c0 [2];
  undefined1 local_2b0 [16];
  undefined4 local_2a0;
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  undefined4 local_278;
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined4 local_250;
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  undefined4 local_200;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined4 local_1d8;
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined4 local_1b0;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  undefined4 local_188;
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  undefined4 local_160;
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined4 local_138;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined4 local_110;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined4 local_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined4 local_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined4 local_48;
  long *local_40 [2];
  long local_30 [2];
  
  this->_vptr_Token = (_func_int **)&PTR__Token_00118548;
  local_2c8[0] = 3;
  local_2c0[0] = local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"&","");
  local_2a0 = 4;
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"|","");
  local_278 = 5;
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"!","");
  local_250 = 6;
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"^","");
  local_228 = 7;
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"~","");
  local_200 = 9;
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"+","");
  local_1d8 = 10;
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"-","");
  local_1b0 = 0xb;
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"*","");
  local_188 = 0xc;
  local_180[0] = local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"/","");
  local_160 = 8;
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"=","");
  local_138 = 0xd;
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"%","");
  local_110 = 0xe;
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"<<","");
  local_e8 = 0xf;
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,">>","");
  local_c0 = 0x10;
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"**","");
  local_98 = 0x13;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,";","");
  local_70 = 0x16;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"(","");
  local_48 = 0x17;
  plVar1 = local_30;
  local_40[0] = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,")","");
  std::
  _Hashtable<calculator::Tag,std::pair<calculator::Tag_const,std::__cxx11::string>,std::allocator<std::pair<calculator::Tag_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<calculator::Tag>,std::hash<calculator::Tag>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<calculator::Tag_const,std::__cxx11::string>const*>
            ((_Hashtable<calculator::Tag,std::pair<calculator::Tag_const,std::__cxx11::string>,std::allocator<std::pair<calculator::Tag_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<calculator::Tag>,std::hash<calculator::Tag>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->tagTable,local_2c8,&stack0xffffffffffffffe0,0,&local_2c9,&local_2ca,
             &local_2cb);
  lVar2 = -0x2a8;
  do {
    if (plVar1 != (long *)plVar1[-2]) {
      operator_delete((long *)plVar1[-2],*plVar1 + 1);
    }
    plVar1 = plVar1 + -5;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0);
  this->__tag = Other;
  this->__c = c;
  return;
}

Assistant:

Token(char c) : __tag(Tag::Other), __c(c) {}